

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O2

idx_t __thiscall
duckdb::WindowTokenTree::Rank(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  value_type vVar6;
  vector<unsigned_int,_true> *pvVar7;
  type pMVar8;
  Elements *this_00;
  const_reference pvVar9;
  const_reference pvVar10;
  Elements *this_01;
  const_reference pvVar11;
  const_reference pvVar12;
  unsigned_long *puVar13;
  unsigned_long uVar14;
  uint *puVar15;
  unsigned_long uVar16;
  size_type sVar17;
  unsigned_long run_begin_1;
  ulong uVar18;
  idx_t iVar19;
  ulong uVar20;
  vector<unsigned_long,_true> *this_02;
  size_type sVar21;
  long lVar22;
  pointer puVar23;
  pointer puVar24;
  ulong uVar25;
  idx_t run_begin;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  size_type sVar29;
  bool bVar30;
  idx_t iStack_b0;
  idx_t local_a8;
  ulong local_a0;
  value_type local_94;
  ulong local_90;
  vector<unsigned_int,_true> *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  type local_68;
  long local_60;
  value_type local_58;
  size_type local_50;
  size_type local_48;
  size_type local_40;
  ulong local_38;
  
  local_70 = lower;
  local_48 = upper;
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    local_68 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
               ::operator*(&(this->super_WindowMergeSortTree).mst32);
    this_01 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
              LowestLevel(local_68);
    pvVar11 = vector<unsigned_int,_true>::get<true>(this_01,row_idx);
    pMVar8 = local_68;
    local_94 = *pvVar11;
    if (lower < upper) {
      if (upper - 1 == lower) {
        iStack_b0 = 1;
        local_a0 = lower;
        local_90 = lower;
      }
      else {
        uVar25 = 1;
        sVar21 = 0;
        uVar18 = upper - 1;
        iVar19 = lower;
        do {
          uVar27 = uVar18;
          iVar19 = iVar19 >> 5;
          uVar25 = uVar25 * 0x20;
          sVar21 = sVar21 + 1;
          uVar18 = uVar27 >> 5;
        } while (iVar19 != uVar27 >> 5);
        local_a0 = uVar25 * uVar27 >> 5;
        if (sVar21 < 3) {
          iStack_b0 = 1;
          local_a8 = 1;
          local_90 = local_a0;
          if (sVar21 == 0) goto LAB_00a89022;
        }
        else {
          uVar28 = iVar19 * uVar25;
          pvVar12 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                    ::get<true>(&local_68->tree,0);
          uVar18 = (long)(pvVar12->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar12->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          if (uVar28 + uVar25 <= uVar18) {
            uVar18 = uVar28 + uVar25;
          }
          local_78 = sVar21;
          pvVar12 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                    ::get<true>(&pMVar8->tree,sVar21);
          puVar5 = (pvVar12->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar15 = ::std::
                    __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar5 + uVar28,puVar5 + uVar18,&local_94);
          uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                             ((long)puVar15 - (long)puVar5 >> 2);
          uVar28 = (uVar28 / uVar25) * 0x40 + (uVar14 & 0xffffffffffffffe0);
          local_50 = (uVar27 | 0xffffffffffffffe0) + uVar28;
          uVar28 = (uint)uVar27 & 0x1f | uVar28;
          local_60 = -local_70;
          local_a8 = 1;
          uVar18 = local_a0;
          do {
            pMVar8 = local_68;
            uVar27 = local_78;
            local_78 = local_78 - 1;
            uVar25 = uVar25 >> 5;
            local_90 = uVar28;
            local_38 = local_a0;
            pvVar12 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                      ::get<true>(&local_68->tree,local_78);
            puVar5 = (pvVar12->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_40 = uVar27;
            pvVar12 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                      ::get<true>(&pMVar8->tree,uVar27);
            local_88 = &pvVar12->second;
            sVar29 = local_50 + 0x1f;
            while (pvVar7 = local_88, uVar25 <= local_60 + uVar18) {
              pvVar11 = vector<unsigned_int,_true>::get<true>(local_88,sVar29);
              uVar3 = *pvVar11;
              pvVar11 = vector<unsigned_int,_true>::get<true>(pvVar7,sVar29 + 0x20);
              puVar15 = ::std::
                        __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                                  (puVar5 + uVar3,puVar5 + *pvVar11,&local_94);
              uVar18 = uVar18 - uVar25;
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar15 - (long)puVar5 >> 2);
              local_a8 = (local_a8 - uVar18) + uVar14;
              sVar29 = sVar29 - 1;
            }
            local_80 = uVar25;
            if (local_60 + uVar18 != 0) {
              pvVar11 = vector<unsigned_int,_true>::get<true>(local_88,sVar29);
              uVar3 = *pvVar11;
              pvVar11 = vector<unsigned_int,_true>::get<true>(pvVar7,sVar29 + 0x20);
              puVar15 = ::std::
                        __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                                  (puVar5 + uVar3,puVar5 + *pvVar11,&local_94);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar15 - (long)puVar5 >> 2);
              sVar29 = (local_70 / local_80) * 0x40 + (uVar14 & 0xffffffffffffffe0);
            }
            local_50 = sVar29;
            uVar28 = local_90;
            uVar25 = local_38;
            for (lVar22 = -local_38; upper = local_48, pvVar7 = local_88,
                local_80 <= local_48 + lVar22; lVar22 = lVar22 - local_80) {
              pvVar11 = vector<unsigned_int,_true>::get<true>(local_88,uVar28);
              uVar3 = *pvVar11;
              pvVar11 = vector<unsigned_int,_true>::get<true>(pvVar7,uVar28 + 0x20);
              puVar15 = ::std::
                        __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                                  (puVar5 + uVar3,puVar5 + *pvVar11,&local_94);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar15 - (long)puVar5 >> 2);
              local_a8 = (local_a8 - uVar25) + uVar14;
              uVar25 = uVar25 + local_80;
              uVar28 = uVar28 + 1;
            }
            local_90 = lVar22;
            if (local_48 + lVar22 != 0) {
              pvVar11 = vector<unsigned_int,_true>::get<true>(local_88,uVar28);
              uVar3 = *pvVar11;
              pvVar11 = vector<unsigned_int,_true>::get<true>(pvVar7,uVar28 + 0x20);
              puVar15 = ::std::
                        __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                                  (puVar5 + uVar3,puVar5 + *pvVar11,&local_94);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar15 - (long)puVar5 >> 2);
              uVar28 = (upper / local_80) * 0x40 + (uVar14 & 0xffffffffffffffe0);
            }
            local_a0 = -local_90;
            uVar25 = local_80;
          } while (2 < local_40);
          local_90 = -local_90;
          sVar21 = 1;
          lower = local_70;
          local_a0 = uVar18;
        }
        local_60 = -lower;
        uVar18 = local_90;
        while (local_90 = uVar18, sVar21 = sVar21 - 1, iStack_b0 = local_a8, sVar21 != 0) {
          local_80 = uVar25 >> 5;
          local_78 = sVar21;
          pvVar12 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                    ::get<true>(&local_68->tree,sVar21);
          uVar25 = local_80;
          puVar5 = (pvVar12->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar22 = local_a0 * 4;
          local_88 = (vector<unsigned_int,_true> *)(local_80 * 4);
          lVar26 = local_80 * -4;
          puVar24 = puVar5 + local_a0;
          for (; upper = local_48, local_80 <= local_60 + local_a0; local_a0 = local_a0 - local_80)
          {
            puVar15 = ::std::
                      __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                                (puVar24 + -uVar25,puVar24,&local_94);
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar15 - (long)puVar5 >> 2);
            uVar16 = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar26 + lVar22 >> 2);
            local_a8 = (uVar14 + local_a8) - uVar16;
            lVar22 = lVar22 - (long)local_88;
            puVar24 = puVar24 + -uVar25;
          }
          uVar27 = local_48 - local_90;
          puVar24 = puVar5 + local_90;
          uVar18 = local_90;
          while (bVar30 = local_80 <= uVar27, uVar27 = uVar27 - local_80, sVar21 = local_78,
                uVar25 = local_80, lower = local_70, bVar30) {
            puVar2 = (pointer)((long)&(local_88->
                                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)puVar24);
            puVar15 = ::std::
                      __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                                (puVar24,puVar2,&local_94);
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar15 - (long)puVar5 >> 2);
            uVar16 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar18);
            local_a8 = (uVar14 + local_a8) - uVar16;
            uVar18 = uVar18 + local_80;
            puVar24 = puVar2;
          }
        }
      }
LAB_00a89022:
      pvVar12 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                ::get<true>(&local_68->tree,0);
      puVar5 = (pvVar12->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; local_a0 != lower; lower = lower + 1) {
        iStack_b0 = iStack_b0 + (puVar5[lower] < local_94);
      }
      for (; upper != local_90; local_90 = local_90 + 1) {
        iStack_b0 = iStack_b0 + (puVar5[local_90] < local_94);
      }
      return iStack_b0;
    }
  }
  else {
    local_68 = (type)unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
                     ::operator*(&(this->super_WindowMergeSortTree).mst64);
    this_00 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
              LowestLevel((MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                           *)local_68);
    pvVar9 = vector<unsigned_long,_true>::get<true>(this_00,row_idx);
    pMVar8 = local_68;
    local_58 = *pvVar9;
    if (lower < upper) {
      if (upper - 1 == lower) {
        uVar18 = lower;
        iStack_b0 = 1;
        local_a0 = lower;
      }
      else {
        uVar25 = 1;
        sVar17 = 0;
        uVar18 = upper - 1;
        iVar19 = lower;
        do {
          uVar27 = uVar18;
          iVar19 = iVar19 >> 5;
          uVar25 = uVar25 * 0x20;
          sVar17 = sVar17 + 1;
          uVar18 = uVar27 >> 5;
        } while (iVar19 != uVar27 >> 5);
        uVar18 = uVar25 * uVar27 >> 5;
        local_a0 = uVar18;
        if (sVar17 < 3) {
          iStack_b0 = 1;
          local_a8 = 1;
          if (sVar17 == 0) goto LAB_00a88f9b;
        }
        else {
          uVar20 = iVar19 * uVar25;
          pvVar10 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                 *)local_68,0);
          uVar28 = (long)(pvVar10->first).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar10->first).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (uVar20 + uVar25 <= uVar28) {
            uVar28 = uVar20 + uVar25;
          }
          local_90 = sVar17;
          pvVar10 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                 *)pMVar8,sVar17);
          puVar4 = (pvVar10->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar13 = ::std::
                    __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar4 + uVar20,puVar4 + uVar28,&local_58);
          uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                             ((long)puVar13 - (long)puVar4 >> 3);
          uVar28 = (uVar20 / uVar25) * 0x40 + (uVar14 & 0xffffffffffffffe0);
          local_50 = (uVar27 | 0xffffffffffffffe0) + uVar28;
          local_88 = (vector<unsigned_int,_true> *)((uint)uVar27 & 0x1f | uVar28);
          local_60 = -local_70;
          local_a8 = 1;
          do {
            pMVar8 = local_68;
            uVar27 = local_90;
            local_90 = local_90 - 1;
            uVar25 = uVar25 >> 5;
            local_78 = uVar18;
            pvVar10 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                   *)local_68,local_90);
            puVar4 = (pvVar10->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_40 = uVar27;
            pvVar10 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                   *)pMVar8,uVar27);
            this_02 = &pvVar10->second;
            sVar29 = local_50 + 0x1f;
            while (uVar25 <= local_60 + local_a0) {
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,sVar29);
              vVar6 = *pvVar9;
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,sVar29 + 0x20);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar4 + vVar6,puVar4 + *pvVar9,&local_58);
              local_a0 = local_a0 - uVar25;
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar4 >> 3);
              local_a8 = (local_a8 - local_a0) + uVar14;
              sVar29 = sVar29 - 1;
            }
            local_80 = uVar25;
            if (local_60 + local_a0 != 0) {
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,sVar29);
              vVar6 = *pvVar9;
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,sVar29 + 0x20);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar4 + vVar6,puVar4 + *pvVar9,&local_58);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar4 >> 3);
              sVar29 = (local_70 / local_80) * 0x40 + (uVar14 & 0xffffffffffffffe0);
            }
            local_50 = sVar29;
            uVar25 = local_78;
            for (sVar21 = -local_78; upper = local_48, pvVar7 = local_88,
                local_80 <= local_48 + sVar21; sVar21 = sVar21 - local_80) {
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,(size_type)local_88);
              vVar6 = *pvVar9;
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,(long)(pvVar7 + 1) + 8);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar4 + vVar6,puVar4 + *pvVar9,&local_58);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar4 >> 3);
              local_a8 = (local_a8 - uVar25) + uVar14;
              uVar25 = uVar25 + local_80;
              local_88 = (vector<unsigned_int,_true> *)
                         ((long)&(pvVar7->super_vector<unsigned_int,_std::allocator<unsigned_int>_>)
                                 .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
            }
            local_78 = sVar21;
            if (local_48 + sVar21 != 0) {
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,(size_type)local_88);
              vVar6 = *pvVar9;
              pvVar9 = vector<unsigned_long,_true>::get<true>(this_02,(long)(pvVar7 + 1) + 8);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar4 + vVar6,puVar4 + *pvVar9,&local_58);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar4 >> 3);
              local_88 = (vector<unsigned_int,_true> *)
                         ((upper / local_80) * 0x40 + (uVar14 & 0xffffffffffffffe0));
            }
            uVar18 = -local_78;
            uVar25 = local_80;
          } while (2 < local_40);
          uVar18 = -local_78;
          sVar17 = 1;
          lower = local_70;
        }
        local_60 = -lower;
        while (sVar17 = sVar17 - 1, iStack_b0 = local_a8, sVar17 != 0) {
          local_80 = uVar25 >> 5;
          local_90 = sVar17;
          local_78 = uVar18;
          pvVar10 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                 *)local_68,sVar17);
          uVar25 = local_80;
          puVar4 = (pvVar10->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar22 = local_a0 * 8;
          local_88 = (vector<unsigned_int,_true> *)(local_80 * 8);
          lVar26 = local_80 * -8;
          puVar23 = puVar4 + local_a0;
          for (; upper = local_48, local_80 <= local_60 + local_a0; local_a0 = local_a0 - local_80)
          {
            puVar13 = ::std::
                      __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                (puVar23 + -uVar25,puVar23,&local_58);
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar13 - (long)puVar4 >> 3);
            uVar16 = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar26 + lVar22 >> 3);
            local_a8 = (uVar14 + local_a8) - uVar16;
            lVar22 = lVar22 - (long)local_88;
            puVar23 = puVar23 + -uVar25;
          }
          uVar27 = local_48 - local_78;
          uVar18 = local_78;
          puVar23 = puVar4 + local_78;
          while (bVar30 = local_80 <= uVar27, uVar27 = uVar27 - local_80, sVar17 = local_90,
                uVar25 = local_80, lower = local_70, bVar30) {
            puVar1 = (pointer)((long)&(local_88->
                                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)puVar23);
            puVar13 = ::std::
                      __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                (puVar23,puVar1,&local_58);
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar13 - (long)puVar4 >> 3);
            uVar16 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar18);
            local_a8 = (uVar14 + local_a8) - uVar16;
            uVar18 = uVar18 + local_80;
            puVar23 = puVar1;
          }
        }
      }
LAB_00a88f9b:
      pvVar10 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                             *)local_68,0);
      puVar4 = (pvVar10->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; local_a0 != lower; lower = lower + 1) {
        iStack_b0 = iStack_b0 + (puVar4[lower] < local_58);
      }
      for (; upper != uVar18; uVar18 = uVar18 + 1) {
        iStack_b0 = iStack_b0 + (puVar4[uVar18] < local_58);
      }
      return iStack_b0;
    }
  }
  return 1;
}

Assistant:

idx_t WindowTokenTree::Rank(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return TokenRank(*mst64, lower, upper, row_idx);
	} else {
		return TokenRank(*mst32, lower, upper, row_idx);
	}
}